

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::do_get(basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
         *this,size_type index)

{
  type tVar1;
  longlong *plVar2;
  uint in_EDX;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_RSI;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_RDI;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *val;
  unsigned_long_long num_args;
  longlong signed_types;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *pbVar3;
  
  if (*(long *)in_RSI < 0) {
    if ((ulong)in_EDX < (ulong)-*(long *)in_RSI) {
      plVar2 = (longlong *)(*(long *)(in_RSI + 8) + (ulong)in_EDX * 0x20);
      (in_RDI->value_).field_0.long_long_value = *plVar2;
      (in_RDI->value_).field_0.string.size = plVar2[1];
      *(longlong *)&in_RDI->type_ = plVar2[2];
      *(longlong *)&in_RDI->field_0x18 = plVar2[3];
    }
    else {
      basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::basic_format_arg(in_RDI);
    }
  }
  else {
    pbVar3 = in_RDI;
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
    ::basic_format_arg(in_RDI);
    if (in_EDX < 0x10) {
      tVar1 = type(in_RSI,in_EDX);
      pbVar3->type_ = tVar1;
      if (pbVar3->type_ != none_type) {
        plVar2 = (longlong *)(*(long *)(in_RSI + 8) + (ulong)in_EDX * 0x10);
        (pbVar3->value_).field_0.long_long_value = *plVar2;
        (pbVar3->value_).field_0.string.size = plVar2[1];
      }
    }
  }
  return in_RDI;
}

Assistant:

format_arg do_get(size_type index) const {
    long long signed_types = static_cast<long long>(types_);
    if (signed_types < 0) {
      unsigned long long num_args =
          static_cast<unsigned long long>(-signed_types);
      return index < num_args ? args_[index] : format_arg();
    }
    format_arg arg;
    if (index > internal::max_packed_args)
      return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type)
      return arg;
    internal::value<Context> &val = arg.value_;
    val = values_[index];
    return arg;
  }